

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  allocator local_479;
  string local_478;
  SceneLoadingTutorialApplication local_458;
  
  bVar1 = embree::TutorialBenchmark::benchmark(argc,argv);
  if (bVar1) {
    embree::TutorialBenchmark::TutorialBenchmark
              ((TutorialBenchmark *)&local_458,embree::renderBenchFunc<embree::Tutorial>);
    std::__cxx11::string::string((string *)&local_478,"default",&local_479);
    iVar2 = embree::TutorialBenchmark::main((TutorialBenchmark *)&local_458,argc,argv,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    embree::TutorialBenchmark::~TutorialBenchmark((TutorialBenchmark *)&local_458);
  }
  else {
    embree::Tutorial::Tutorial((Tutorial *)&local_458);
    iVar2 = embree::SceneLoadingTutorialApplication::main(&local_458,argc,argv);
    embree::SceneLoadingTutorialApplication::~SceneLoadingTutorialApplication(&local_458);
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  if (embree::TutorialBenchmark::benchmark(argc, argv)) {
    return embree::TutorialBenchmark(embree::renderBenchFunc<embree::Tutorial>).main(argc, argv);
  }
  return embree::Tutorial().main(argc,argv);
}